

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O0

Token * embree::Token::Eof(void)

{
  Token *in_RDI;
  ParseLocation *in_stack_ffffffffffffffa8;
  
  ParseLocation::ParseLocation((ParseLocation *)in_RDI);
  Token(in_RDI,in_stack_ffffffffffffffa8);
  ParseLocation::~ParseLocation((ParseLocation *)0x46d890);
  return in_RDI;
}

Assistant:

static Token Eof()                { return Token(); }